

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O2

size_t qHash(longdouble key,size_t seed)

{
  uint64_t uVar1;
  long in_FS_OFFSET;
  longdouble local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (longdouble)0 + key;
  uVar1 = murmurhash(&local_18,0x10,seed);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(long double key, size_t seed) noexcept
{
    // ensure -0 gets mapped to 0
    key += static_cast<long double>(0.0);
    if constexpr (sizeof(long double) == sizeof(size_t)) {
        size_t k;
        memcpy(&k, &key, sizeof(long double));
        return QHashPrivate::hash(k, seed);
    } else {
        return murmurhash(&key, sizeof(key), seed);
    }
}